

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_conn.c
# Opt level: O2

int proxy_conn_in_use(proxy_conn_handle *pc)

{
  mutex_handle *mutex;
  long *plVar1;
  long lVar2;
  
  plVar1 = (long *)pc->priv;
  mutex = (mutex_handle *)(plVar1 + 0xd);
  mutex_lock_shared(mutex);
  lVar2 = *plVar1;
  mutex_unlock_shared(mutex);
  return (int)(lVar2 != 0);
}

Assistant:

int proxy_conn_in_use(struct proxy_conn_handle *pc)
{
	struct proxy_conn_priv *priv = pc->priv;
	int ret = 0;

	mutex_lock_shared(&priv->mutex_client);

	if (priv->conn_client != NULL)
		ret = 1;

	mutex_unlock_shared(&priv->mutex_client);

	return ret;
}